

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O0

int rgbcx::interp_half_6(int v0,int v1,int c0,int c1,bc1_approx_mode mode)

{
  int in_ECX;
  int in_EDX;
  undefined4 in_R8D;
  int local_4;
  
  switch(in_R8D) {
  case 0:
  case 3:
  default:
    local_4 = interp_half_5_6_ideal(in_EDX,in_ECX);
    break;
  case 1:
    local_4 = interp_half_6_nv(in_EDX,in_ECX);
    break;
  case 2:
    local_4 = interp_half_5_6_amd(in_EDX,in_ECX);
  }
  return local_4;
}

Assistant:

static inline int interp_half_6(int v0, int v1, int c0, int c1, bc1_approx_mode mode) 
	{ 
		(void)v0; (void)v1;
		assert(scale_6_to_8(v0) == c0 && scale_6_to_8(v1) == c1);
		switch (mode)
		{
		case bc1_approx_mode::cBC1NVidia: return interp_half_6_nv(c0, c1); 
		case bc1_approx_mode::cBC1AMD: return interp_half_5_6_amd(c0, c1);
		case bc1_approx_mode::cBC1Ideal: 
		case bc1_approx_mode::cBC1IdealRound4: 
		default:
			return interp_half_5_6_ideal(c0, c1);		
		}
	}